

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSimBase.c
# Opt level: O2

void Gia_SimAbsSolve(Gia_SimAbsMan_t *p)

{
  Vec_Wrd_t *p_00;
  int iVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  abctime aVar5;
  ulong uVar6;
  word *pwVar7;
  word *pwVar8;
  abctime aVar9;
  int iVar10;
  ulong uVar11;
  abctime time;
  byte bVar12;
  uint uVar13;
  int iVar14;
  
  aVar5 = Abc_Clock();
  uVar6 = (long)p->vPatPairs->nSize / 2;
  iVar10 = (((int)uVar6 >> 6) + 1) - (uint)((uVar6 & 0x3f) == 0);
  p->nWordsTable = iVar10;
  p_00 = p->vCoverTable;
  uVar13 = (p->nCands + 1) * iVar10;
  Vec_WrdGrow(p_00,uVar13);
  uVar6 = 0;
  uVar11 = 0;
  if (0 < (int)uVar13) {
    uVar11 = (ulong)uVar13;
  }
  for (; uVar11 != uVar6; uVar6 = uVar6 + 1) {
    p_00->pArray[uVar6] = 0;
  }
  p_00->nSize = uVar13;
  pwVar7 = Vec_WrdEntryP(p->vCoverTable,p->nCands * p->nWordsTable);
  p->pTableTemp = pwVar7;
  iVar10 = 0;
  do {
    if (p->nCands <= iVar10) {
      p->vResub->nSize = 0;
      Abc_TtClear(p->pTableTemp,p->nWordsTable);
      pwVar7 = p->pTableTemp;
      uVar6 = (long)p->vPatPairs->nSize / 2;
      uVar11 = uVar6 & 0xffffffff;
      uVar13 = 0;
      if ((int)uVar6 < 1) {
        uVar11 = 0;
        uVar13 = 0;
      }
      for (; (uint)uVar11 != uVar13; uVar13 = uVar13 + 1) {
        pwVar7[uVar13 >> 6] = pwVar7[uVar13 >> 6] ^ 1L << ((byte)uVar13 & 0x3f);
      }
      uVar13 = p->nWordsTable;
      while (iVar10 = Abc_TtIsConst0(pwVar7,uVar13), iVar10 == 0) {
        iVar10 = -1;
        iVar1 = -1;
        for (iVar14 = 0; iVar14 < p->nCands; iVar14 = iVar14 + 1) {
          pwVar8 = Vec_WrdEntryP(p->vCoverTable,uVar13 * iVar14);
          pwVar7 = p->pTableTemp;
          uVar13 = p->nWordsTable;
          uVar11 = 0;
          uVar6 = 0;
          if (0 < (int)uVar13) {
            uVar6 = (ulong)uVar13;
          }
          iVar2 = 0;
          for (; uVar6 != uVar11; uVar11 = uVar11 + 1) {
            iVar3 = Abc_TtCountOnes(pwVar8[uVar11] & pwVar7[uVar11]);
            iVar2 = iVar2 + iVar3;
          }
          if (iVar10 < iVar2) {
            iVar1 = iVar14;
          }
          if (iVar10 <= iVar2) {
            iVar10 = iVar2;
          }
        }
        Vec_IntPush(p->vResub,iVar1);
        pwVar8 = Vec_WrdEntryP(p->vCoverTable,iVar1 * p->nWordsTable);
        pwVar7 = p->pTableTemp;
        uVar13 = p->nWordsTable;
        uVar6 = 0;
        if (0 < (int)uVar13) {
          uVar6 = (ulong)uVar13;
        }
        for (uVar11 = 0; uVar6 != uVar11; uVar11 = uVar11 + 1) {
          pwVar7[uVar11] = pwVar7[uVar11] & ~pwVar8[uVar11];
        }
      }
      if (p->fVerbose == 0) {
        return;
      }
      printf("Solution %2d for covering problem [%5d x %5d]: ",(ulong)(uint)p->vResub->nSize,
             (long)p->vPatPairs->nSize / 2 & 0xffffffff,(ulong)(uint)p->nCands);
      for (uVar13 = 0; (int)uVar13 < p->vResub->nSize; uVar13 = uVar13 + 1) {
        uVar4 = Vec_IntEntry(p->vResub,uVar13);
        printf("%6d ",(ulong)uVar4);
      }
      for (; uVar13 < 0xc; uVar13 = uVar13 + 1) {
        printf("       ");
      }
      printf("   ");
      aVar9 = Abc_Clock();
      Abc_PrintTime(0x82525c,(char *)(aVar9 - aVar5),time);
      return;
    }
    pwVar7 = Vec_WrdEntryP(p->vSims,p->nWords * iVar10);
    pwVar8 = Vec_WrdEntryP(p->vCoverTable,p->nWordsTable * iVar10);
    bVar12 = 0;
    uVar6 = 0;
    while( true ) {
      iVar14 = (int)uVar6;
      iVar1 = p->vPatPairs->nSize;
      if (iVar1 <= iVar14 + 1) break;
      iVar1 = Vec_IntEntry(p->vPatPairs,iVar14);
      iVar2 = Vec_IntEntry(p->vPatPairs,iVar14 + 1);
      iVar3 = Vec_IntEntry(p->vValues,iVar1);
      if (iVar3 != 0) {
        __assert_fail("Vec_IntEntry(p->vValues, iPat) == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaSimBase.c"
                      ,0x49f,"void Gia_SimAbsSolve(Gia_SimAbsMan_t *)");
      }
      iVar3 = Vec_IntEntry(p->vValues,iVar2);
      if (iVar3 != 1) {
        __assert_fail("Vec_IntEntry(p->vValues, iPat2) == 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaSimBase.c"
                      ,0x4a0,"void Gia_SimAbsSolve(Gia_SimAbsMan_t *)");
      }
      if ((((uint)(pwVar7[iVar2 >> 6] >> ((byte)iVar2 & 0x3f)) ^
           (uint)(pwVar7[iVar1 >> 6] >> ((byte)iVar1 & 0x3f))) & 1) != 0) {
        pwVar8[uVar6 >> 7] = pwVar8[uVar6 >> 7] ^ 1L << (bVar12 & 0x3f);
      }
      uVar6 = (ulong)(iVar14 + 2);
      bVar12 = bVar12 + 1;
    }
    iVar10 = iVar10 + 1;
    if (iVar14 != iVar1) {
      __assert_fail("k == Vec_IntSize(p->vPatPairs)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaSimBase.c"
                    ,0x4a4,"void Gia_SimAbsSolve(Gia_SimAbsMan_t *)");
    }
  } while( true );
}

Assistant:

void Gia_SimAbsSolve( Gia_SimAbsMan_t * p )
{
    abctime clk = Abc_Clock();
    int i, k, iPat, iPat2;
/*
    Vec_Int_t * vSimPats = Vec_IntDup( p->vPatPairs );
    Vec_IntUniqify( vSimPats );
    printf( "Selected %d pattern pairs contain %d unique patterns.\n", Vec_IntSize(p->vPatPairs)/2, Vec_IntSize(vSimPats) );
    Vec_IntFree( vSimPats );
*/
    // set up the covering problem
    p->nWordsTable = Abc_Bit6WordNum( Vec_IntSize(p->vPatPairs)/2 );
    Vec_WrdFill( p->vCoverTable, p->nWordsTable * (p->nCands + 1), 0 );
    p->pTableTemp = Vec_WrdEntryP( p->vCoverTable, p->nWordsTable * p->nCands );
    for ( i = 0; i < p->nCands; i++ )
    {
        word * pSimCand  = Vec_WrdEntryP( p->vSims, p->nWords * i );
        word * pSimTable = Vec_WrdEntryP( p->vCoverTable, p->nWordsTable * i );
        //printf( "%4d : ", i );
        //Extra_PrintBinary( stdout, (word *)pSimCand, p->nCands );  printf( "\n" );
        Vec_IntForEachEntryDouble( p->vPatPairs, iPat, iPat2, k )
        {
            assert( Vec_IntEntry(p->vValues, iPat)  == 0 );
            assert( Vec_IntEntry(p->vValues, iPat2) == 1 );
            if ( Abc_TtGetBit(pSimCand, iPat) != Abc_TtGetBit(pSimCand, iPat2) )
                Abc_TtXorBit(pSimTable, k/2);
        }
        assert( k == Vec_IntSize(p->vPatPairs) );
    }

    if ( 0 )
    {
        printf( "                  " );
        for ( i = 0; i < p->nCands; i++ )
            printf( "%d", i % 10 );
        printf( "\n" );

        Vec_IntForEachEntryDouble( p->vPatPairs, iPat, iPat2, i )
        {
            printf( "%4d  ", i/2 );
            printf( "%4d  ", iPat );
            printf( "%4d  ", iPat2 );
            for ( k = 0; k < p->nCands; k++ )
            {
                word * pSimTable = Vec_WrdEntryP( p->vCoverTable, p->nWordsTable * k );
                printf( "%c", Abc_TtGetBit(pSimTable, i/2) ? '*' : ' ' );
            }
            printf( "\n" );
        }
    }

    //Gia_SimAbsCheckSolution(p);

    Vec_IntClear( p->vResub );
    Abc_TtClear( p->pTableTemp, p->nWordsTable );
    for ( i = 0; i < Vec_IntSize(p->vPatPairs)/2; i++ )
        Abc_TtXorBit( p->pTableTemp, i );

    while ( !Abc_TtIsConst0(p->pTableTemp, p->nWordsTable) )
    {
        word * pSimTable;
        int iArgMax = -1, CostThis, CostMax = -1;
        // compute the cost of each column
        for ( i = 0; i < p->nCands; i++ )
        {
            pSimTable = Vec_WrdEntryP( p->vCoverTable, p->nWordsTable * i );
            CostThis = Abc_TtCountOnesVecMask( pSimTable, p->pTableTemp, p->nWordsTable, 0 );
            if ( CostMax >= CostThis )
                continue;
            CostMax = CostThis;
            iArgMax = i;
        }
        // find the best column
        Vec_IntPush( p->vResub, iArgMax );
        // delete values of this column
        pSimTable = Vec_WrdEntryP( p->vCoverTable, p->nWordsTable * iArgMax );
        Abc_TtSharp( p->pTableTemp, p->pTableTemp, pSimTable, p->nWordsTable );
    }
    if ( p->fVerbose )
    {
        printf( "Solution %2d for covering problem [%5d x %5d]: ", Vec_IntSize(p->vResub), Vec_IntSize(p->vPatPairs)/2, p->nCands );
        Vec_IntForEachEntry( p->vResub, iPat, i )
            printf( "%6d ", iPat );
        for ( ; i < 12; i++ )
            printf( "       " );
        printf( "   " );
        Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
    }
}